

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O3

EbmlElement * __thiscall libebml::EbmlMaster::AddNewElt(EbmlMaster *this,EbmlCallbacks *Callbacks)

{
  EbmlElement *pEVar1;
  EbmlElement *local_18;
  
  pEVar1 = (*Callbacks->Create)();
  local_18 = pEVar1;
  std::vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>>::
  emplace_back<libebml::EbmlElement*>
            ((vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>> *)
             &this->ElementList,&local_18);
  return pEVar1;
}

Assistant:

EbmlElement *EbmlMaster::AddNewElt(const EbmlCallbacks & Callbacks)
{
  // add the element
  EbmlElement *NewElt = &EBML_INFO_CREATE(Callbacks);
  if (NewElt == NULL)
    return NULL;

  if (!PushElement(*NewElt)) {
    delete NewElt;
    NewElt = NULL;
  }
  return NewElt;
}